

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O1

int __thiscall CLayer::AddPenalty(CLayer *this,int iPenalty)

{
  CBoundary *this_00;
  int iVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var3 = (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      this_00 = (CBoundary *)p_Var3[1]._M_parent;
      iVar1 = CBoundary::AddPenalty(this_00,iPenalty);
      if (iVar2 <= iVar1) {
        iVar2 = CBoundary::AddPenalty(this_00,iPenalty);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return iVar2;
}

Assistant:

int CLayer::AddPenalty(int iPenalty)
{
	int	iMaxPenalty	=	0;

	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		CBoundary*	pBoundary	=	itr->second;

		iMaxPenalty	=	MAX(iMaxPenalty,pBoundary->AddPenalty(iPenalty));
	}
	return	iMaxPenalty;
}